

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

void __thiscall Fl_Tabs::draw_tab(Fl_Tabs *this,int x1,int x2,int W,int H,Fl_Widget *o,int what)

{
  char cVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color FVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Fl_Tabs *pFVar11;
  bool bVar12;
  Fl_Color local_c0;
  Fl_Color local_a4;
  Fl_Color local_7c;
  Fl_Color local_68;
  Fl_Boxtype local_5c;
  Fl_Color oc_1;
  Fl_Color c_1;
  Fl_Color oc;
  Fl_Color c;
  int yofs;
  Fl_Boxtype bt;
  char prev_draw_shortcut;
  int dy;
  int dh;
  int sel;
  Fl_Widget *o_local;
  int H_local;
  int W_local;
  int x2_local;
  int x1_local;
  Fl_Tabs *this_local;
  
  bVar12 = what == 2;
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dh(FVar2);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dy(FVar2);
  cVar1 = fl_draw_shortcut;
  fl_draw_shortcut = '\x01';
  if ((o != this->push_) || (bVar12)) {
    local_5c = Fl_Widget::box((Fl_Widget *)this);
  }
  else {
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    local_5c = fl_down(FVar2);
  }
  iVar10 = 2;
  if (bVar12) {
    iVar10 = 0;
  }
  W_local = x1;
  if ((x2 < x1 + W) && (what == 1)) {
    W_local = x2 - W;
  }
  if (H < 0) {
    iVar5 = -H;
    if (bVar12) {
      iVar8 = Fl_Widget::y((Fl_Widget *)this);
      iVar9 = Fl_Widget::h((Fl_Widget *)this);
      fl_push_clip(W_local,(iVar8 + iVar9 + H) - iVar4,x2 - W_local,iVar5 + iVar4);
    }
    else {
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar8 = Fl_Widget::h((Fl_Widget *)this);
      fl_push_clip(W_local,iVar4 + iVar8 + H,x2 - W_local,iVar5);
    }
    iVar3 = iVar3 + iVar5;
    if (bVar12) {
      local_a4 = Fl_Widget::selection_color((Fl_Widget *)this);
    }
    else {
      local_a4 = Fl_Widget::selection_color(o);
    }
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,local_5c,W_local,((iVar4 + iVar5) - iVar3) + -10,W,
                        (iVar3 + 10) - iVar10,local_a4);
    FVar6 = Fl_Widget::labelcolor(o);
    if (bVar12) {
      local_c0 = Fl_Widget::labelcolor((Fl_Widget *)this);
    }
    else {
      local_c0 = Fl_Widget::labelcolor(o);
    }
    Fl_Widget::labelcolor(o,local_c0);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Widget::draw_label(o,W_local,(iVar4 + iVar5) - iVar3,W,iVar3 - iVar10,0);
    Fl_Widget::labelcolor(o,FVar6);
    pFVar11 = (Fl_Tabs *)Fl::focus();
    if (pFVar11 == this) {
      uVar7 = Fl_Widget::visible(o);
      if (uVar7 != 0) {
        FVar2 = Fl_Widget::box((Fl_Widget *)this);
        iVar4 = Fl_Widget::y((Fl_Widget *)this);
        iVar10 = Fl_Widget::h((Fl_Widget *)this);
        Fl_Widget::draw_focus((Fl_Widget *)this,FVar2,W_local,(iVar4 + iVar10) - iVar3,W,iVar3);
      }
    }
    fl_pop_clip();
  }
  else {
    if (bVar12) {
      iVar5 = Fl_Widget::y((Fl_Widget *)this);
      fl_push_clip(W_local,iVar5,x2 - W_local,(H + iVar3) - iVar4);
    }
    else {
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      fl_push_clip(W_local,iVar4,x2 - W_local,H);
    }
    iVar3 = iVar3 + H;
    if (bVar12) {
      local_68 = Fl_Widget::selection_color((Fl_Widget *)this);
    }
    else {
      local_68 = Fl_Widget::selection_color(o);
    }
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,local_5c,W_local,iVar4 + iVar10,W,(iVar3 + 10) - iVar10,
                        local_68);
    FVar6 = Fl_Widget::labelcolor(o);
    if (bVar12) {
      local_7c = Fl_Widget::labelcolor((Fl_Widget *)this);
    }
    else {
      local_7c = Fl_Widget::labelcolor(o);
    }
    Fl_Widget::labelcolor(o,local_7c);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    Fl_Widget::draw_label(o,W_local,iVar4 + iVar10,W,iVar3 - iVar10,0);
    Fl_Widget::labelcolor(o,FVar6);
    pFVar11 = (Fl_Tabs *)Fl::focus();
    if (pFVar11 == this) {
      uVar7 = Fl_Widget::visible(o);
      if (uVar7 != 0) {
        FVar2 = Fl_Widget::box((Fl_Widget *)this);
        iVar4 = Fl_Widget::y((Fl_Widget *)this);
        Fl_Widget::draw_focus((Fl_Widget *)this,FVar2,W_local,iVar4,W,iVar3);
      }
    }
    fl_pop_clip();
  }
  fl_draw_shortcut = cVar1;
  return;
}

Assistant:

void Fl_Tabs::draw_tab(int x1, int x2, int W, int H, Fl_Widget* o, int what) {
  int sel = (what == SELECTED);
  int dh = Fl::box_dh(box());
  int dy = Fl::box_dy(box());
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  Fl_Boxtype bt = (o==push_ &&!sel) ? fl_down(box()) : box();

  // compute offsets to make selected tab look bigger
  int yofs = sel ? 0 : BORDER;

  if ((x2 < x1+W) && what == RIGHT) x1 = x2 - W;

  if (H >= 0) {
    if (sel) fl_push_clip(x1, y(), x2 - x1, H + dh - dy);
    else fl_push_clip(x1, y(), x2 - x1, H);

    H += dh;

    Fl_Color c = sel ? selection_color() : o->selection_color();

    draw_box(bt, x1, y() + yofs, W, H + 10 - yofs, c);

    // Save the previous label color
    Fl_Color oc = o->labelcolor();

    // Draw the label using the current color...
    o->labelcolor(sel ? labelcolor() : o->labelcolor());
    o->draw_label(x1, y() + yofs, W, H - yofs, FL_ALIGN_CENTER);

    // Restore the original label color...
    o->labelcolor(oc);

    if (Fl::focus() == this && o->visible())
      draw_focus(box(), x1, y(), W, H);

    fl_pop_clip();
  } else {
    H = -H;

    if (sel) fl_push_clip(x1, y() + h() - H - dy, x2 - x1, H + dy);
    else fl_push_clip(x1, y() + h() - H, x2 - x1, H);

    H += dh;

    Fl_Color c = sel ? selection_color() : o->selection_color();

    draw_box(bt, x1, y() + h() - H - 10, W, H + 10 - yofs, c);

    // Save the previous label color
    Fl_Color oc = o->labelcolor();

    // Draw the label using the current color...
    o->labelcolor(sel ? labelcolor() : o->labelcolor());
    o->draw_label(x1, y() + h() - H, W, H - yofs, FL_ALIGN_CENTER);

    // Restore the original label color...
    o->labelcolor(oc);

    if (Fl::focus() == this && o->visible())
      draw_focus(box(), x1, y() + h() - H, W, H);

    fl_pop_clip();
  }
  fl_draw_shortcut = prev_draw_shortcut;
}